

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O0

int mz_deflate(mz_streamp pStream,int flush)

{
  mz_ulong mVar1;
  mz_ulong mVar2;
  tdefl_status tVar3;
  mz_uint32 mVar4;
  int local_44;
  tdefl_status defl_status;
  int mz_status;
  mz_ulong orig_total_out;
  mz_ulong orig_total_in;
  size_t out_bytes;
  size_t in_bytes;
  mz_streamp pmStack_18;
  int flush_local;
  mz_streamp pStream_local;
  
  local_44 = 0;
  if ((((pStream == (mz_streamp)0x0) || (pStream->state == (mz_internal_state *)0x0)) || (flush < 0)
      ) || ((4 < flush || (pStream->next_out == (uchar *)0x0)))) {
    pStream_local._4_4_ = -2;
  }
  else if (pStream->avail_out == 0) {
    pStream_local._4_4_ = -5;
  }
  else {
    in_bytes._4_4_ = flush;
    if (flush == 1) {
      in_bytes._4_4_ = TDEFL_SYNC_FLUSH;
    }
    if (*(int *)(pStream->state + 0x84) == 1) {
      pStream_local._4_4_ = -5;
      if (in_bytes._4_4_ == TDEFL_FINISH) {
        pStream_local._4_4_ = 1;
      }
    }
    else {
      mVar1 = pStream->total_in;
      mVar2 = pStream->total_out;
      pmStack_18 = pStream;
      do {
        out_bytes = (size_t)pmStack_18->avail_in;
        orig_total_in = (mz_ulong)pmStack_18->avail_out;
        tVar3 = tdefl_compress((tdefl_compressor *)pmStack_18->state,pmStack_18->next_in,&out_bytes,
                               pmStack_18->next_out,&orig_total_in,in_bytes._4_4_);
        pmStack_18->next_in = pmStack_18->next_in + (out_bytes & 0xffffffff);
        pmStack_18->avail_in = pmStack_18->avail_in - (int)out_bytes;
        pmStack_18->total_in = (out_bytes & 0xffffffff) + pmStack_18->total_in;
        mVar4 = tdefl_get_adler32((tdefl_compressor *)pmStack_18->state);
        pmStack_18->adler = (ulong)mVar4;
        pmStack_18->next_out = pmStack_18->next_out + (orig_total_in & 0xffffffff);
        pmStack_18->avail_out = pmStack_18->avail_out - (int)orig_total_in;
        pmStack_18->total_out = (orig_total_in & 0xffffffff) + pmStack_18->total_out;
        if (tVar3 < TDEFL_STATUS_OKAY) {
          local_44 = -2;
          goto LAB_00107aa6;
        }
        if (tVar3 == TDEFL_STATUS_DONE) {
          local_44 = 1;
          goto LAB_00107aa6;
        }
        if (pmStack_18->avail_out == 0) goto LAB_00107aa6;
      } while ((pmStack_18->avail_in != 0) || (in_bytes._4_4_ == TDEFL_FINISH));
      if ((in_bytes._4_4_ == TDEFL_NO_FLUSH) &&
         ((pmStack_18->total_in == mVar1 && (pmStack_18->total_out == mVar2)))) {
        pStream_local._4_4_ = -5;
      }
      else {
LAB_00107aa6:
        pStream_local._4_4_ = local_44;
      }
    }
  }
  return pStream_local._4_4_;
}

Assistant:

int mz_deflate(mz_streamp pStream, int flush) {
  size_t in_bytes, out_bytes;
  mz_ulong orig_total_in, orig_total_out;
  int mz_status = MZ_OK;

  if ((!pStream) || (!pStream->state) || (flush < 0) || (flush > MZ_FINISH) ||
      (!pStream->next_out))
    return MZ_STREAM_ERROR;
  if (!pStream->avail_out)
    return MZ_BUF_ERROR;

  if (flush == MZ_PARTIAL_FLUSH)
    flush = MZ_SYNC_FLUSH;

  if (((tdefl_compressor *)pStream->state)->m_prev_return_status ==
      TDEFL_STATUS_DONE)
    return (flush == MZ_FINISH) ? MZ_STREAM_END : MZ_BUF_ERROR;

  orig_total_in = pStream->total_in;
  orig_total_out = pStream->total_out;
  for (;;) {
    tdefl_status defl_status;
    in_bytes = pStream->avail_in;
    out_bytes = pStream->avail_out;

    defl_status = tdefl_compress((tdefl_compressor *)pStream->state,
                                 pStream->next_in, &in_bytes, pStream->next_out,
                                 &out_bytes, (tdefl_flush)flush);
    pStream->next_in += (mz_uint)in_bytes;
    pStream->avail_in -= (mz_uint)in_bytes;
    pStream->total_in += (mz_uint)in_bytes;
    pStream->adler = tdefl_get_adler32((tdefl_compressor *)pStream->state);

    pStream->next_out += (mz_uint)out_bytes;
    pStream->avail_out -= (mz_uint)out_bytes;
    pStream->total_out += (mz_uint)out_bytes;

    if (defl_status < 0) {
      mz_status = MZ_STREAM_ERROR;
      break;
    } else if (defl_status == TDEFL_STATUS_DONE) {
      mz_status = MZ_STREAM_END;
      break;
    } else if (!pStream->avail_out)
      break;
    else if ((!pStream->avail_in) && (flush != MZ_FINISH)) {
      if ((flush) || (pStream->total_in != orig_total_in) ||
          (pStream->total_out != orig_total_out))
        break;
      return MZ_BUF_ERROR; /* Can't make forward progress without some input.
                            */
    }
  }
  return mz_status;
}